

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O3

void __thiscall Diligent::ThreadPoolImpl::WaitForAllTasks(ThreadPoolImpl *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->m_TasksQueueMtx;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if (((this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) ||
     (0 < (this->m_NumRunningTasks).super___atomic_base<int>._M_i)) {
    while (((this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 ||
           ((this->m_NumRunningTasks).super___atomic_base<int>._M_i != 0))) {
      std::condition_variable::wait((unique_lock *)&this->m_TasksFinishedCond);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

WaitForAllTasks() override final
    {
        std::unique_lock<std::mutex> lock{m_TasksQueueMtx};
        if (!m_TasksQueue.empty() || m_NumRunningTasks.load() > 0)
        {
            m_TasksFinishedCond.wait(lock,
                                     [this] //
                                     {
                                         return m_TasksQueue.empty() && m_NumRunningTasks.load() == 0;
                                     } //
            );
        }
    }